

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O1

bool __thiscall
glslang::TSymbolValidater::qualifierCheck
          (TSymbolValidater *this,TType *type1,TType *type2,string *name,bool isBlock)

{
  pointer pcVar1;
  TSymbolValidater *pTVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined3 in_register_00000081;
  string errorStr;
  long *local_58 [2];
  long local_48 [2];
  TSymbolValidater *local_38;
  long lVar5;
  undefined4 extraout_var_00;
  
  local_38 = this;
  iVar4 = (*type1->_vptr_TType[0xb])(type1);
  lVar5 = CONCAT44(extraout_var,iVar4);
  iVar4 = (*type2->_vptr_TType[0xb])(type2);
  lVar6 = CONCAT44(extraout_var_00,iVar4);
  if (CONCAT31(in_register_00000081,isBlock) == 0) {
    iVar4 = (*type1->_vptr_TType[0xb])(type1);
    if ((*(uint *)(CONCAT44(extraout_var_01,iVar4) + 8) & 0x7f) != 5) goto LAB_00483ac9;
    iVar4 = (*type2->_vptr_TType[0xb])(type2);
    if ((*(uint *)(CONCAT44(extraout_var_02,iVar4) + 8) & 0x7f) != 5) goto LAB_00483ac9;
LAB_00483af6:
    if (((*(uint *)(lVar6 + 8) ^ *(uint *)(lVar5 + 8)) & 0xe000000) == 0) {
      bVar3 = false;
    }
    else {
      pcVar1 = (name->_M_dataplus)._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar1,pcVar1 + name->_M_string_length);
      std::__cxx11::string::append((char *)local_58);
      TInfoSinkBase::message(&local_38->infoSink->info,EPrefixError,(char *)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      bVar3 = true;
    }
    if (((*(char *)(lVar5 + 0x2c) != '\0') && (*(char *)(lVar6 + 0x2c) != '\0')) &&
       (*(char *)(lVar5 + 0x2c) != *(char *)(lVar6 + 0x2c))) {
      pcVar1 = (name->_M_dataplus)._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar1,pcVar1 + name->_M_string_length);
      std::__cxx11::string::append((char *)local_58);
      TInfoSinkBase::message(&local_38->infoSink->info,EPrefixError,(char *)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      bVar3 = true;
    }
  }
  else {
LAB_00483ac9:
    iVar4 = (*type1->_vptr_TType[0xb])(type1);
    if ((*(uint *)(CONCAT44(extraout_var_03,iVar4) + 8) & 0x7f) == 1) {
      iVar4 = (*type2->_vptr_TType[0xb])(type2);
      if ((*(uint *)(CONCAT44(extraout_var_04,iVar4) + 8) & 0x7f) == 1) goto LAB_00483af6;
    }
    bVar3 = false;
  }
  pTVar2 = local_38;
  if (isBlock) {
    if (((*(byte *)(lVar6 + 0x10) ^ *(byte *)(lVar5 + 0x10)) & 0xf) != 0) {
      pcVar1 = (name->_M_dataplus)._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar1,pcVar1 + name->_M_string_length);
      std::__cxx11::string::append((char *)local_58);
      TInfoSinkBase::message(&pTVar2->infoSink->info,EPrefixError,(char *)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      bVar3 = true;
    }
    if ((*(ulong *)(lVar6 + 8) ^ *(ulong *)(lVar5 + 8)) >> 0x3d != 0) {
      pcVar1 = (name->_M_dataplus)._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar1,pcVar1 + name->_M_string_length);
      std::__cxx11::string::append((char *)local_58);
      TInfoSinkBase::message(&pTVar2->infoSink->info,EPrefixError,(char *)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      bVar3 = true;
    }
    if (*(int *)(lVar5 + 0x14) != *(int *)(lVar6 + 0x14)) {
      pcVar1 = (name->_M_dataplus)._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar1,pcVar1 + name->_M_string_length);
      std::__cxx11::string::append((char *)local_58);
      TInfoSinkBase::message(&pTVar2->infoSink->info,EPrefixError,(char *)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      bVar3 = true;
    }
    if (*(int *)(lVar5 + 0x18) != *(int *)(lVar6 + 0x18)) {
      pcVar1 = (name->_M_dataplus)._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar1,pcVar1 + name->_M_string_length);
      std::__cxx11::string::append((char *)local_58);
      TInfoSinkBase::message(&pTVar2->infoSink->info,EPrefixError,(char *)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool qualifierCheck(const TType* const type1, const TType* const type2, const std::string& name, bool isBlock)
    {
        bool hasError = false;
        const TQualifier& qualifier1 = type1->getQualifier();
        const TQualifier& qualifier2 = type2->getQualifier();

        if (((isBlock == false) &&
            (type1->getQualifier().storage == EvqUniform && type2->getQualifier().storage == EvqUniform)) ||
            (type1->getQualifier().storage == EvqGlobal && type2->getQualifier().storage == EvqGlobal)) {
            if (qualifier1.precision != qualifier2.precision) {
                hasError = true;
                std::string errorStr = name + ": have precision conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
            if (qualifier1.hasFormat() && qualifier2.hasFormat()) {
                if (qualifier1.layoutFormat != qualifier2.layoutFormat) {
                    hasError = true;
                    std::string errorStr = name + ": have layout format conflict cross stage.";
                    infoSink.info.message(EPrefixError, errorStr.c_str());
                }

            }
        }

        if (isBlock == true) {
            if (qualifier1.layoutPacking != qualifier2.layoutPacking) {
                hasError = true;
                std::string errorStr = name + ": have layoutPacking conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
            if (qualifier1.layoutMatrix != qualifier2.layoutMatrix) {
                hasError = true;
                std::string errorStr = name + ": have layoutMatrix conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
            if (qualifier1.layoutOffset != qualifier2.layoutOffset) {
                hasError = true;
                std::string errorStr = name + ": have layoutOffset conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
            if (qualifier1.layoutAlign != qualifier2.layoutAlign) {
                hasError = true;
                std::string errorStr = name + ": have layoutAlign conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
        }

        return hasError;
    }